

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  pointer ppvVar1;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  pointer ppvVar2;
  
  ppvVar1 = (this->aux_vecs).
            super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar2 = (this->aux_vecs).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppvVar2 != ppvVar1;
      ppvVar2 = ppvVar2 + 1) {
    this_00 = &(*ppvVar2)->super__Vector_base<float,_std::allocator<float>_>;
    if (this_00 != (_Vector_base<float,_std::allocator<float>_> *)0x0) {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
    }
    operator_delete(this_00);
  }
  std::
  _Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  ::~_Vector_base(&(this->aux_vecs).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                 );
  std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  ~_Vector_base(&(this->aligns).
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               );
  LSTMBuilder::~LSTMBuilder(&this->builder_src_bwd);
  LSTMBuilder::~LSTMBuilder(&this->builder_src_fwd);
  LSTMBuilder::~LSTMBuilder(&this->builder);
  std::_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~_Vector_base
            (&(this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
  ;
  return;
}

Assistant:

AttentionalModel<Builder>::~AttentionalModel()
{
    for (auto v: aux_vecs)
        delete v;
}